

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOffsets
          (MessageGenerator *this,Printer *p)

{
  anon_unknown_0 *this_00;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FieldOptions *this_01;
  OneofDescriptor *pOVar5;
  DescriptorStringView args;
  LogMessage *pLVar6;
  size_type sVar7;
  reference pvVar8;
  reference piVar9;
  undefined1 split;
  Options *in_RCX;
  FieldDescriptor *field_00;
  AlphaNum *a;
  Iterator IVar10;
  Iterator IVar11;
  undefined1 auVar12 [16];
  pair<unsigned_long,_unsigned_long> pVar13;
  allocator<char> local_421;
  AlphaNum local_420;
  AlphaNum local_3f0;
  undefined1 local_3c0 [8];
  string index_1;
  iterator iStack_398;
  int inlined_string_index;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  AlphaNum local_378;
  undefined1 local_348 [8];
  string index;
  size_t i;
  LogMessageFatal local_310 [23];
  Voidify local_2f9;
  string *local_2f8;
  string *absl_log_internal_check_op_result;
  value_type oneof;
  Iterator __end3_1;
  Iterator __begin3_1;
  OneOfRangeImpl *__range3_1;
  undefined1 local_2b0 [4];
  int count;
  byte local_279;
  string local_278;
  AlphaNum local_258;
  undefined1 local_228 [32];
  char *local_208;
  value_type_conflict local_200;
  value_type_conflict field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  size_t entries;
  size_t offsets;
  undefined1 local_1b0 [4];
  int kNumGenericOffsets;
  Formatter format;
  Span<const_google::protobuf::io::Printer::Sub> local_170;
  undefined1 local_160 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Options local_138;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_68;
  Span<const_google::protobuf::io::Printer::Sub> local_50;
  undefined1 local_40 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Printer *p_local;
  MessageGenerator *this_local;
  
  this_00 = (anon_unknown_0 *)this->descriptor_;
  v.storage_.callback_buffer_._8_8_ = p;
  cpp::Options::Options(&local_138,&this->options_);
  anon_unknown_0::ClassVars(&local_68,this_00,(Descriptor *)&local_138,in_RCX);
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_50,&local_68);
  io::Printer::WithVars
            ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
              *)local_40,p,local_50);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_68);
  cpp::Options::~Options(&local_138);
  uVar1 = v.storage_.callback_buffer_._8_8_;
  MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)((long)&format.vars_.
                              super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              .
                              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              .settings_.
                              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                              .
                              super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                      + 0x18),this->descriptor_,&this->options_);
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_170,
             (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)((long)&format.vars_.
                        super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                + 0x18));
  io::Printer::WithVars
            ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
              *)local_160,(Printer *)uVar1,local_170);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)((long)&format.vars_.
                     super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .
                     super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
             + 0x18));
  Formatter::Formatter((Formatter *)local_1b0,(Printer *)v.storage_.callback_buffer_._8_8_);
  bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
  if ((!bVar2) || (bVar2 = IsMapEntryMessage(this->descriptor_), bVar2)) {
    Formatter::operator()<>
              ((Formatter *)local_1b0,"PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n");
  }
  else {
    Formatter::operator()<>((Formatter *)local_1b0,"~0u,  // no _has_bits_\n");
  }
  Formatter::operator()<>
            ((Formatter *)local_1b0,"PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n");
  iVar3 = Descriptor::extension_range_count(this->descriptor_);
  if (iVar3 < 1) {
    Formatter::operator()<>((Formatter *)local_1b0,"~0u,  // no _extensions_\n");
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_1b0,"PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n");
  }
  iVar3 = Descriptor::real_oneof_decl_count(this->descriptor_);
  if (iVar3 < 1) {
    Formatter::operator()<>((Formatter *)local_1b0,"~0u,  // no _oneof_case_\n");
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_1b0,"PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n");
  }
  if (this->num_weak_fields_ < 1) {
    Formatter::operator()<>((Formatter *)local_1b0,"~0u,  // no _weak_field_map_\n");
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_1b0,"PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n");
  }
  bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->inlined_string_indices_);
  if (bVar2) {
    Formatter::operator()<>((Formatter *)local_1b0,"~0u,  // no _inlined_string_donated_\n");
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_1b0,
               "PROTOBUF_FIELD_OFFSET($classtype$, $inlined_string_donated_array$),\n");
  }
  bVar2 = ShouldSplit(this->descriptor_,&this->options_);
  if (bVar2) {
    Formatter::operator()<>
              ((Formatter *)local_1b0,
               "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\nsizeof($classtype$::Impl_::Split),\n")
    ;
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_1b0,"~0u,  // no _split_\n~0u,  // no sizeof(Split)\n");
  }
  offsets._4_4_ = 8;
  iVar3 = Descriptor::field_count(this->descriptor_);
  iVar4 = Descriptor::real_oneof_decl_count(this->descriptor_);
  __range3 = (FieldRangeImpl<google::protobuf::Descriptor> *)(long)(iVar3 + 8 + iVar4);
  entries = (size_t)__range3;
  __begin3.descriptor =
       (Descriptor *)protobuf::internal::FieldRange<google::protobuf::Descriptor>(this->descriptor_)
  ;
  IVar10 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::begin
                     ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __begin3._0_8_ = IVar10.descriptor;
  __end3.descriptor._0_4_ = IVar10.idx;
  IVar10 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::end
                     ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __end3._0_8_ = IVar10.descriptor;
  field._0_4_ = IVar10.idx;
  while (bVar2 = protobuf::internal::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&field),
        bVar2) {
    local_200 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::
                operator*((Iterator *)&__end3.descriptor);
    this_01 = FieldDescriptor::options(local_200);
    bVar2 = FieldOptions::weak(this_01);
    if ((bVar2) ||
       (pOVar5 = FieldDescriptor::real_containing_oneof(local_200), pOVar5 != (OneofDescriptor *)0x0
       )) {
      Formatter::operator()<>((Formatter *)local_1b0,"::_pbi::kInvalidFieldOffsetTag");
    }
    else {
      bVar2 = ShouldSplit(local_200,&this->options_);
      split = 0x12;
      local_208 = "";
      if (bVar2) {
        local_208 = "::Impl_::Split";
      }
      local_279 = 0;
      bVar2 = ShouldSplit(local_200,&this->options_);
      if (bVar2) {
        FieldName_abi_cxx11_(&local_278,(cpp *)local_200,field_00);
        local_279 = 1;
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_258,&local_278);
        absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)local_2b0,"_");
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_228,&local_258);
      }
      else {
        FieldMemberName_abi_cxx11_
                  ((string *)local_228,(cpp *)local_200,(FieldDescriptor *)0x0,(bool)split);
      }
      Formatter::operator()
                ((Formatter *)local_1b0,"PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",&local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
      std::__cxx11::string::~string((string *)local_228);
      if ((local_279 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_278);
      }
    }
    bVar2 = ShouldSplit(local_200,&this->options_);
    if (bVar2) {
      Formatter::operator()<>((Formatter *)local_1b0," | ::_pbi::kSplitFieldOffsetMask /*split*/");
    }
    bVar2 = IsEagerlyVerifiedLazy(local_200,&this->options_,this->scc_analyzer_);
    if (bVar2) {
      Formatter::operator()<>((Formatter *)local_1b0," | 0x1u /*eagerly verified lazy*/");
    }
    else {
      bVar2 = IsStringInlined(local_200,&this->options_);
      if (bVar2) {
        Formatter::operator()<>((Formatter *)local_1b0," | 0x1u /*inlined*/");
      }
    }
    Formatter::operator()<>((Formatter *)local_1b0,",\n");
    protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
              ((Iterator *)&__end3.descriptor);
  }
  __range3_1._4_4_ = 0;
  __begin3_1.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
  IVar11 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3_1.descriptor);
  __begin3_1._0_8_ = IVar11.descriptor;
  __end3_1.descriptor._0_4_ = IVar11.idx;
  IVar11 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3_1.descriptor);
  __end3_1._0_8_ = IVar11.descriptor;
  oneof._0_4_ = IVar11.idx;
  while (bVar2 = cpp::operator!=((Iterator *)&__end3_1.descriptor,(Iterator *)&oneof), bVar2) {
    absl_log_internal_check_op_result =
         (string *)OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3_1.descriptor);
    args = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)absl_log_internal_check_op_result);
    Formatter::operator()
              ((Formatter *)local_1b0,"PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n",args);
    __range3_1._4_4_ = __range3_1._4_4_ + 1;
    OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3_1.descriptor);
  }
  iVar3 = absl::lts_20240722::log_internal::GetReferenceableValue(__range3_1._4_4_);
  iVar4 = Descriptor::real_oneof_decl_count(this->descriptor_);
  iVar4 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar4);
  local_2f8 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                        (iVar3,iVar4,"count == descriptor_->real_oneof_decl_count()");
  if (local_2f8 != (string *)0x0) {
    auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2f8);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_310,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
               ,0xa15,auVar12._0_8_,auVar12._8_8_);
    pLVar6 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_310);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_2f9,pLVar6);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_310);
  }
  bVar2 = IsMapEntryMessage(this->descriptor_);
  if (bVar2) {
    __range3 = (FieldRangeImpl<google::protobuf::Descriptor> *)((long)&__range3->descriptor + 2);
    Formatter::operator()<>((Formatter *)local_1b0,"0,\n1,\n");
  }
  else {
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
    if (!bVar2) {
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->has_bit_indices_);
      __range3 = (FieldRangeImpl<google::protobuf::Descriptor> *)
                 ((long)&__range3->descriptor + sVar7);
      for (index.field_2._8_8_ = 0; uVar1 = index.field_2._8_8_,
          sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->has_bit_indices_),
          (ulong)uVar1 < sVar7; index.field_2._8_8_ = index.field_2._8_8_ + 1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->has_bit_indices_,index.field_2._8_8_);
        __range4._6_1_ = 0;
        if (*pvVar8 < 0) {
          std::allocator<char>::allocator();
          __range4._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_348,"~0u",(allocator<char> *)((long)&__range4 + 7));
        }
        else {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->has_bit_indices_,index.field_2._8_8_);
          absl::lts_20240722::AlphaNum::AlphaNum(&local_378,*pvVar8);
          absl::lts_20240722::StrCat_abi_cxx11_((string *)local_348,(lts_20240722 *)&local_378,a);
        }
        if ((__range4._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
        }
        Formatter::operator()
                  ((Formatter *)local_1b0,"$1$,\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
        std::__cxx11::string::~string((string *)local_348);
      }
    }
  }
  bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->inlined_string_indices_);
  if (!bVar2) {
    sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->inlined_string_indices_);
    __range3 = (FieldRangeImpl<google::protobuf::Descriptor> *)((long)&__range3->descriptor + sVar7)
    ;
    __end4 = std::vector<int,_std::allocator<int>_>::begin(&this->inlined_string_indices_);
    iStack_398 = std::vector<int,_std::allocator<int>_>::end(&this->inlined_string_indices_);
    while (bVar2 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffc68), bVar2) {
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end4);
      index_1.field_2._12_4_ = *piVar9;
      if ((int)index_1.field_2._12_4_ < 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_3c0,"~0u,",&local_421);
        std::allocator<char>::~allocator(&local_421);
      }
      else {
        absl::lts_20240722::AlphaNum::AlphaNum(&local_3f0,index_1.field_2._12_4_);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_420,",  // inlined_string_index");
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_3c0,&local_3f0);
      }
      Formatter::operator()
                ((Formatter *)local_1b0,"$1$\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
      std::__cxx11::string::~string((string *)local_3c0);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end4);
    }
  }
  pVar13 = std::make_pair<unsigned_long&,unsigned_long_const&>((unsigned_long *)&__range3,&entries);
  Formatter::~Formatter((Formatter *)local_1b0);
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
              *)local_160);
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
              *)local_40);
  return pVar13;
}

Assistant:

std::pair<size_t, size_t> MessageGenerator::GenerateOffsets(io::Printer* p) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  Formatter format(p);

  if (!has_bit_indices_.empty() || IsMapEntryMessage(descriptor_)) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n");
  } else {
    format("~0u,  // no _has_bits_\n");
  }
  format("PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n");
  if (descriptor_->extension_range_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n");
  } else {
    format("~0u,  // no _extensions_\n");
  }
  if (descriptor_->real_oneof_decl_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n");
  } else {
    format("~0u,  // no _oneof_case_\n");
  }
  if (num_weak_fields_ > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n");
  } else {
    format("~0u,  // no _weak_field_map_\n");
  }
  if (!inlined_string_indices_.empty()) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, "
        "$inlined_string_donated_array$),\n");
  } else {
    format("~0u,  // no _inlined_string_donated_\n");
  }
  if (ShouldSplit(descriptor_, options_)) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\n"
        "sizeof($classtype$::Impl_::Split),\n");
  } else {
    format(
        "~0u,  // no _split_\n"
        "~0u,  // no sizeof(Split)\n");
  }
  const int kNumGenericOffsets = 8;  // the number of fixed offsets above
  const size_t offsets = kNumGenericOffsets + descriptor_->field_count() +
                         descriptor_->real_oneof_decl_count();
  size_t entries = offsets;
  for (auto field : FieldRange(descriptor_)) {
    // TODO: We should not have an entry in the offset table for fields
    // that do not use them.
    if (field->options().weak() || field->real_containing_oneof()) {
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      format("::_pbi::kInvalidFieldOffsetTag");
    } else {
      format("PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",
             ShouldSplit(field, options_) ? "::Impl_::Split" : "",
             ShouldSplit(field, options_)
                 ? absl::StrCat(FieldName(field), "_")
                 : FieldMemberName(field, /*split=*/false));
    }

    // Some information about a field is in the pdproto profile. The profile is
    // only available at compile time. So we embed such information in the
    // offset of the field, so that the information is available when
    // reflectively accessing the field at run time.
    //
    // We embed whether the field is cold to the MSB of the offset, and whether
    // the field is eagerly verified lazy or inlined string to the LSB of the
    // offset.

    if (ShouldSplit(field, options_)) {
      format(" | ::_pbi::kSplitFieldOffsetMask /*split*/");
    }
    if (IsEagerlyVerifiedLazy(field, options_, scc_analyzer_)) {
      format(" | 0x1u /*eagerly verified lazy*/");
    } else if (IsStringInlined(field, options_)) {
      format(" | 0x1u /*inlined*/");
    }
    format(",\n");
  }

  int count = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n", oneof->name());
    count++;
  }
  ABSL_CHECK_EQ(count, descriptor_->real_oneof_decl_count());

  if (IsMapEntryMessage(descriptor_)) {
    entries += 2;
    format(
        "0,\n"
        "1,\n");
  } else if (!has_bit_indices_.empty()) {
    entries += has_bit_indices_.size();
    for (size_t i = 0; i < has_bit_indices_.size(); ++i) {
      const std::string index =
          has_bit_indices_[i] >= 0 ? absl::StrCat(has_bit_indices_[i]) : "~0u";
      format("$1$,\n", index);
    }
  }
  if (!inlined_string_indices_.empty()) {
    entries += inlined_string_indices_.size();
    for (int inlined_string_index : inlined_string_indices_) {
      const std::string index =
          inlined_string_index >= 0
              ? absl::StrCat(inlined_string_index, ",  // inlined_string_index")
              : "~0u,";
      format("$1$\n", index);
    }
  }

  return std::make_pair(entries, offsets);
}